

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRTreeBuildVisitor.cpp
# Opt level: O0

void __thiscall IRTreeBuildVisitor::Visit(IRTreeBuildVisitor *this,LogicalExpression *expression)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  string *__lhs;
  ExpressionWrapper *pEVar4;
  ConstExpression *pCVar5;
  SubtreeWrapper *pSVar6;
  NegativeConditionalWrapper *this_00;
  SubtreeWrapper *second;
  AndConditionalWrapper *this_01;
  OrConditionalWrapper *this_02;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  RelativeConditionalWrapper *pRVar7;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  SubtreeWrapper *rhs;
  SubtreeWrapper *lhs;
  SubtreeWrapper *wrapper;
  string *op;
  LogicalExpression *expression_local;
  IRTreeBuildVisitor *this_local;
  
  __lhs = &expression->operation_;
  if ((expression->lhs_ == (Expression *)0x0) && (expression->rhs_ == (Expression *)0x0)) {
    bVar1 = std::operator==(__lhs,"true");
    if (bVar1) {
      pEVar4 = (ExpressionWrapper *)operator_new(0x10);
      pCVar5 = (ConstExpression *)operator_new(0x10);
      IRT::ConstExpression::ConstExpression(pCVar5,1);
      IRT::ExpressionWrapper::ExpressionWrapper(pEVar4,(Expression *)pCVar5);
      (this->super_TemplateVisitor<IRT::SubtreeWrapper_*>).tos_value_ = (SubtreeWrapper *)pEVar4;
    }
    else {
      bVar1 = std::operator==(__lhs,"false");
      if (bVar1) {
        pEVar4 = (ExpressionWrapper *)operator_new(0x10);
        pCVar5 = (ConstExpression *)operator_new(0x10);
        IRT::ConstExpression::ConstExpression(pCVar5,0);
        IRT::ExpressionWrapper::ExpressionWrapper(pEVar4,(Expression *)pCVar5);
        (this->super_TemplateVisitor<IRT::SubtreeWrapper_*>).tos_value_ = (SubtreeWrapper *)pEVar4;
      }
    }
  }
  else if (expression->lhs_ == (Expression *)0x0) {
    pSVar6 = TemplateVisitor<IRT::SubtreeWrapper_*>::Accept
                       (&this->super_TemplateVisitor<IRT::SubtreeWrapper_*>,
                        &expression->rhs_->super_Node);
    this_00 = (NegativeConditionalWrapper *)operator_new(0x10);
    IRT::NegativeConditionalWrapper::NegativeConditionalWrapper(this_00,pSVar6);
    (this->super_TemplateVisitor<IRT::SubtreeWrapper_*>).tos_value_ = (SubtreeWrapper *)this_00;
  }
  else {
    pSVar6 = TemplateVisitor<IRT::SubtreeWrapper_*>::Accept
                       (&this->super_TemplateVisitor<IRT::SubtreeWrapper_*>,
                        &expression->lhs_->super_Node);
    second = TemplateVisitor<IRT::SubtreeWrapper_*>::Accept
                       (&this->super_TemplateVisitor<IRT::SubtreeWrapper_*>,
                        &expression->rhs_->super_Node);
    bVar1 = std::operator==(__lhs,"&&");
    if (bVar1) {
      this_01 = (AndConditionalWrapper *)operator_new(0x18);
      IRT::AndConditionalWrapper::AndConditionalWrapper(this_01,pSVar6,second);
      (this->super_TemplateVisitor<IRT::SubtreeWrapper_*>).tos_value_ = (SubtreeWrapper *)this_01;
    }
    else {
      bVar1 = std::operator==(__lhs,"||");
      if (bVar1) {
        this_02 = (OrConditionalWrapper *)operator_new(0x18);
        IRT::OrConditionalWrapper::OrConditionalWrapper(this_02,pSVar6,second);
        (this->super_TemplateVisitor<IRT::SubtreeWrapper_*>).tos_value_ = (SubtreeWrapper *)this_02;
      }
      else {
        bVar1 = std::operator==(__lhs,"==");
        if (bVar1) {
          pRVar7 = (RelativeConditionalWrapper *)operator_new(0x20);
          iVar2 = (*pSVar6->_vptr_SubtreeWrapper[2])();
          iVar3 = (*second->_vptr_SubtreeWrapper[2])();
          IRT::RelativeConditionalWrapper::RelativeConditionalWrapper
                    (pRVar7,EQ,(Expression *)CONCAT44(extraout_var,iVar2),
                     (Expression *)CONCAT44(extraout_var_00,iVar3));
          (this->super_TemplateVisitor<IRT::SubtreeWrapper_*>).tos_value_ = (SubtreeWrapper *)pRVar7
          ;
        }
        else {
          bVar1 = std::operator==(__lhs,">");
          if (bVar1) {
            pRVar7 = (RelativeConditionalWrapper *)operator_new(0x20);
            iVar2 = (*pSVar6->_vptr_SubtreeWrapper[2])();
            iVar3 = (*second->_vptr_SubtreeWrapper[2])();
            IRT::RelativeConditionalWrapper::RelativeConditionalWrapper
                      (pRVar7,GT,(Expression *)CONCAT44(extraout_var_01,iVar2),
                       (Expression *)CONCAT44(extraout_var_02,iVar3));
            (this->super_TemplateVisitor<IRT::SubtreeWrapper_*>).tos_value_ =
                 (SubtreeWrapper *)pRVar7;
          }
          else {
            bVar1 = std::operator==(__lhs,"<");
            if (bVar1) {
              pRVar7 = (RelativeConditionalWrapper *)operator_new(0x20);
              iVar2 = (*pSVar6->_vptr_SubtreeWrapper[2])();
              iVar3 = (*second->_vptr_SubtreeWrapper[2])();
              IRT::RelativeConditionalWrapper::RelativeConditionalWrapper
                        (pRVar7,LT,(Expression *)CONCAT44(extraout_var_03,iVar2),
                         (Expression *)CONCAT44(extraout_var_04,iVar3));
              (this->super_TemplateVisitor<IRT::SubtreeWrapper_*>).tos_value_ =
                   (SubtreeWrapper *)pRVar7;
            }
            else {
              bVar1 = std::operator==(__lhs,">=");
              if (bVar1) {
                pRVar7 = (RelativeConditionalWrapper *)operator_new(0x20);
                iVar2 = (*pSVar6->_vptr_SubtreeWrapper[2])();
                iVar3 = (*second->_vptr_SubtreeWrapper[2])();
                IRT::RelativeConditionalWrapper::RelativeConditionalWrapper
                          (pRVar7,GE,(Expression *)CONCAT44(extraout_var_05,iVar2),
                           (Expression *)CONCAT44(extraout_var_06,iVar3));
                (this->super_TemplateVisitor<IRT::SubtreeWrapper_*>).tos_value_ =
                     (SubtreeWrapper *)pRVar7;
              }
              else {
                bVar1 = std::operator==(__lhs,"<=");
                if (bVar1) {
                  pRVar7 = (RelativeConditionalWrapper *)operator_new(0x20);
                  iVar2 = (*pSVar6->_vptr_SubtreeWrapper[2])();
                  iVar3 = (*second->_vptr_SubtreeWrapper[2])();
                  IRT::RelativeConditionalWrapper::RelativeConditionalWrapper
                            (pRVar7,LE,(Expression *)CONCAT44(extraout_var_07,iVar2),
                             (Expression *)CONCAT44(extraout_var_08,iVar3));
                  (this->super_TemplateVisitor<IRT::SubtreeWrapper_*>).tos_value_ =
                       (SubtreeWrapper *)pRVar7;
                }
                else {
                  bVar1 = std::operator==(__lhs,"!=");
                  if (bVar1) {
                    pRVar7 = (RelativeConditionalWrapper *)operator_new(0x20);
                    iVar2 = (*pSVar6->_vptr_SubtreeWrapper[2])();
                    iVar3 = (*second->_vptr_SubtreeWrapper[2])();
                    IRT::RelativeConditionalWrapper::RelativeConditionalWrapper
                              (pRVar7,NE,(Expression *)CONCAT44(extraout_var_09,iVar2),
                               (Expression *)CONCAT44(extraout_var_10,iVar3));
                    (this->super_TemplateVisitor<IRT::SubtreeWrapper_*>).tos_value_ =
                         (SubtreeWrapper *)pRVar7;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void IRTreeBuildVisitor::Visit(LogicalExpression* expression) {
  const std::string& op = expression->operation_;
  if (expression->lhs_ == nullptr && expression->rhs_ == nullptr) {
    if (op == "true") {
      tos_value_ = new IRT::ExpressionWrapper(new IRT::ConstExpression(1));
    } else if (op == "false") {
      tos_value_ = new IRT::ExpressionWrapper(new IRT::ConstExpression(0));
    }
  } else if (expression->lhs_ == nullptr) {
    auto wrapper = Accept(expression->rhs_);
    tos_value_ = new IRT::NegativeConditionalWrapper(wrapper);
  } else {
    auto lhs = Accept(expression->lhs_);
    auto rhs = Accept(expression->rhs_);

    if (op == "&&") {
      tos_value_ = new IRT::AndConditionalWrapper(lhs, rhs);
    } else if (op == "||") {
      tos_value_ = new IRT::OrConditionalWrapper(lhs, rhs);
    } else if (op == "==") {
      tos_value_ = new IRT::RelativeConditionalWrapper(
          IRT::LogicOperatorType::EQ, lhs->ToExpression(), rhs->ToExpression());
    } else if (op == ">") {
      tos_value_ = new IRT::RelativeConditionalWrapper(
          IRT::LogicOperatorType::GT, lhs->ToExpression(), rhs->ToExpression());
    } else if (op == "<") {
      tos_value_ = new IRT::RelativeConditionalWrapper(
          IRT::LogicOperatorType::LT, lhs->ToExpression(), rhs->ToExpression());
    } else if (op == ">=") {
      tos_value_ = new IRT::RelativeConditionalWrapper(
          IRT::LogicOperatorType::GE, lhs->ToExpression(), rhs->ToExpression()
          );
    } else if (op == "<=") {
      tos_value_ = new IRT::RelativeConditionalWrapper(
          IRT::LogicOperatorType::LE, lhs->ToExpression(), rhs->ToExpression()
      );
    } else if (op == "!=") {
      tos_value_ = new IRT::RelativeConditionalWrapper(
          IRT::LogicOperatorType::NE, lhs->ToExpression(), rhs->ToExpression()
      );
    }
  }
}